

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_setup.cpp
# Opt level: O3

Box * the_nodes(Box *__return_storage_ptr__,Box *b)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int i;
  long lVar5;
  
  uVar2 = *(undefined8 *)(b->smallend).vect;
  uVar3 = *(undefined8 *)((b->smallend).vect + 2);
  uVar4 = *(undefined8 *)((b->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(b->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar2;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar3;
  lVar5 = 0;
  do {
    if (((__return_storage_ptr__->btype).itype >> ((uint)lVar5 & 0x1f) & 1) == 0) {
      piVar1 = (__return_storage_ptr__->bigend).vect + lVar5;
      *piVar1 = *piVar1 + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  (__return_storage_ptr__->btype).itype = 7;
  return __return_storage_ptr__;
}

Assistant:

static Box the_nodes (const Box& b) { return amrex::surroundingNodes(b); }